

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ClampWindowRect(ImGuiWindow *window,ImRect *rect,ImVec2 *padding)

{
  ImVec2 IVar1;
  ImGuiContext *g;
  uint uVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  if (((GImGui->IO).ConfigWindowsMoveFromTitleBarOnly == true) && ((window->Flags & 1) == 0)) {
    fVar4 = GImGui->FontBaseSize * window->FontWindowScale;
    if (window->ParentWindow != (ImGuiWindow *)0x0) {
      fVar4 = fVar4 * window->ParentWindow->FontWindowScale;
    }
    fVar11 = (window->Size).x;
    fVar5 = (GImGui->Style).FramePadding.y;
    fVar4 = fVar5 + fVar5 + fVar4;
  }
  else {
    fVar11 = (window->Size).x;
    fVar4 = (window->Size).y;
  }
  fVar5 = (rect->Max).x - padding->x;
  fVar6 = (rect->Max).y - padding->y;
  fVar9 = (window->Pos).x + fVar11;
  fVar10 = (window->Pos).y + fVar4;
  fVar7 = padding->x + (rect->Min).x;
  fVar8 = padding->y + (rect->Min).y;
  uVar2 = -(uint)(fVar7 <= fVar9);
  uVar3 = -(uint)(fVar8 <= fVar10);
  fVar11 = (float)(~uVar2 & (uint)fVar7 | (uint)fVar9 & uVar2) - fVar11;
  fVar4 = (float)(~uVar3 & (uint)fVar8 | (uint)fVar10 & uVar3) - fVar4;
  if (fVar11 <= fVar5) {
    fVar5 = fVar11;
  }
  if (fVar4 <= fVar6) {
    fVar6 = fVar4;
  }
  IVar1.y = fVar6;
  IVar1.x = fVar5;
  window->Pos = IVar1;
  return;
}

Assistant:

static inline void ClampWindowRect(ImGuiWindow* window, const ImRect& rect, const ImVec2& padding)
{
    ImGuiContext& g = *GImGui;
    ImVec2 size_for_clamping = (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(window->Flags & ImGuiWindowFlags_NoTitleBar)) ? ImVec2(window->Size.x, window->TitleBarHeight()) : window->Size;
    window->Pos = ImMin(rect.Max - padding, ImMax(window->Pos + size_for_clamping, rect.Min + padding) - size_for_clamping);
}